

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O0

static_metric_manager<test_id_t<9UL>_> *
ylt::metric::static_metric_manager<test_id_t<9UL>_>::instance(void)

{
  int iVar1;
  static_metric_manager<test_id_t<9UL>_> *__s;
  
  if (static_metric_manager<test_id_t<9ul>>::instance()::inst == '\0') {
    iVar1 = __cxa_guard_acquire(&static_metric_manager<test_id_t<9ul>>::instance()::inst);
    if (iVar1 != 0) {
      __s = (static_metric_manager<test_id_t<9UL>_> *)operator_new(0x38);
      memset(__s,0,0x38);
      static_metric_manager((static_metric_manager<test_id_t<9UL>_> *)0x248417);
      instance::inst = __s;
      __cxa_guard_release(&static_metric_manager<test_id_t<9ul>>::instance()::inst);
    }
  }
  return instance::inst;
}

Assistant:

static static_metric_manager<Tag>& instance() {
    static auto* inst = new static_metric_manager<Tag>();
    return *inst;
  }